

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
punky::ast::IntLiteral::to_string_abi_cxx11_(string *__return_storage_ptr__,IntLiteral *this)

{
  std::__cxx11::to_string(__return_storage_ptr__,this->m_int_value);
  return __return_storage_ptr__;
}

Assistant:

std::string IntLiteral::to_string() const
{
    return std::to_string(m_int_value);
}